

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.h
# Opt level: O2

bool mpt::assign<mpt::text*>(text **from,int type,void *ptr)

{
  bool bVar1;
  int iVar2;
  
  if (0 < type) {
    iVar2 = type_properties<mpt::text_*>::id(true);
    if (iVar2 == type) {
      bVar1 = true;
      if (ptr != (void *)0x0) {
        *(text **)ptr = *from;
      }
    }
    else {
      bVar1 = false;
    }
    return bVar1;
  }
  return false;
}

Assistant:

bool assign(const T &from, int type, void *ptr) {
	/* bad arg or type ID registration error */
	if (type <= 0 || type != type_properties<T>::id(true)) {
		return false;
	}
	if (ptr) {
		*static_cast<T *>(ptr) = from;
	}
	return true;
}